

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::RunProtocWithArgs
          (CommandLineInterfaceTester *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  size_t sVar2;
  lts_20250127 *this_00;
  int iVar3;
  size_t i;
  ulong uVar4;
  size_type in_R9;
  long lVar5;
  string_view s;
  FixedMapping replacements;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  string local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&argv,(long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_70
            );
  lVar5 = 0;
  for (uVar4 = 0;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar4 = uVar4 + 1) {
    sVar2 = *(size_t *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5);
    this_00 = *(lts_20250127 **)((long)&pbVar1->_M_string_length + lVar5);
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<const_char_(&)[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_50,(char (*) [8])0xe82ec4,&this->temp_directory_);
    s._M_str = (char *)&local_50;
    s._M_len = sVar2;
    replacements._M_len = in_R9;
    replacements._M_array = (iterator)0x1;
    absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_70,this_00,s,replacements);
    std::__cxx11::string::operator=
              ((string *)
               ((long)&(((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5),
               (string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] =
         *(char **)((long)&(((args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5)
    ;
    lVar5 = lVar5 + 0x20;
  }
  CaptureTestStdout();
  CaptureTestStderr();
  iVar3 = CommandLineInterface::Run
                    (&this->cli_,
                     (int)((ulong)((long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 5),
                     argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start);
  this->return_code_ = iVar3;
  GetCapturedTestStderr_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->captured_stderr_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  GetCapturedTestStdout_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->captured_stdout_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return;
}

Assistant:

void CommandLineInterfaceTester::RunProtocWithArgs(
    std::vector<std::string> args) {
  std::vector<const char*> argv(args.size());

  for (size_t i = 0; i < args.size(); i++) {
    args[i] = absl::StrReplaceAll(args[i], {{"$tmpdir", temp_directory_}});
    argv[i] = args[i].c_str();
  }

  // TODO: Cygwin doesn't work well if we try to capture stderr and
  // stdout at the same time. Need to figure out why and add this capture back
  // for Cygwin.
#if !defined(__CYGWIN__)
  CaptureTestStdout();
#endif
  CaptureTestStderr();

  return_code_ = cli_.Run(static_cast<int>(args.size()), argv.data());

  captured_stderr_ = GetCapturedTestStderr();
#if !defined(__CYGWIN__)
  captured_stdout_ = GetCapturedTestStdout();
#endif
}